

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O1

void monster_list_format_section
               (monster_list_t *list,textblock *tb,monster_list_section_t section,
               wchar_t lines_to_display,wchar_t max_width,char *prefix,_Bool show_others,
               size_t *max_width_result)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  monster_list_entry_t *pmVar4;
  uint8_t attr;
  ushort uVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  uint16_t *puVar13;
  long lVar14;
  long lVar15;
  wchar_t wVar16;
  char *pcVar17;
  char *pcVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  ulong local_168;
  char location [20];
  char asleep [20];
  char line_buffer [200];
  
  pcVar17 = ":";
  if (lines_to_display == L'\0') {
    pcVar17 = ".";
  }
  pcVar6 = "other ";
  if (!show_others) {
    pcVar6 = "";
  }
  if (list->entries != (monster_list_entry_t *)0x0) {
    uVar12 = (ulong)section;
    uVar1 = list->total_monsters[uVar12];
    if (uVar1 == 0) {
      sVar7 = strnfmt(line_buffer,200,"%s no monsters.\n",prefix);
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"%s",line_buffer);
      }
      if (max_width_result != (size_t *)0x0) {
        sVar19 = 0x28;
        if (0x28 < sVar7) {
          sVar19 = sVar7;
        }
        *max_width_result = sVar19;
      }
    }
    else {
      uVar2 = list->distinct_entries;
      uVar20 = (ulong)uVar2;
      pcVar18 = "s";
      if (uVar1 == 1) {
        pcVar18 = "";
      }
      uVar21 = 0;
      local_168 = strnfmt(line_buffer,200,"%s %d %smonster%s%s\n",prefix,(ulong)uVar1,pcVar6,pcVar18
                          ,pcVar17);
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"%s",line_buffer);
      }
      if (L'\0' < lines_to_display && uVar20 != 0) {
        lVar9 = uVar12 * 2;
        lVar14 = 0;
        uVar21 = 0;
        wVar16 = L'\0';
        do {
          asleep[0x10] = '\0';
          asleep[0x11] = '\0';
          asleep[0x12] = '\0';
          asleep[0x13] = '\0';
          asleep[0] = '\0';
          asleep[1] = '\0';
          asleep[2] = '\0';
          asleep[3] = '\0';
          asleep[4] = '\0';
          asleep[5] = '\0';
          asleep[6] = '\0';
          asleep[7] = '\0';
          asleep[8] = '\0';
          asleep[9] = '\0';
          asleep[10] = '\0';
          asleep[0xb] = '\0';
          asleep[0xc] = '\0';
          asleep[0xd] = '\0';
          asleep[0xe] = '\0';
          asleep[0xf] = '\0';
          location[0x10] = '\0';
          location[0x11] = '\0';
          location[0x12] = '\0';
          location[0x13] = '\0';
          location[0] = '\0';
          location[1] = '\0';
          location[2] = '\0';
          location[3] = '\0';
          location[4] = '\0';
          location[5] = '\0';
          location[6] = '\0';
          location[7] = '\0';
          location[8] = '\0';
          location[9] = '\0';
          location[10] = '\0';
          location[0xb] = '\0';
          location[0xc] = '\0';
          location[0xd] = '\0';
          location[0xe] = '\0';
          location[0xf] = '\0';
          line_buffer[0] = '\0';
          pmVar4 = list->entries;
          sVar3 = *(short *)((long)pmVar4->count + lVar14 + lVar9);
          if (sVar3 != 0) {
            if (sVar3 == 1) {
              uVar1 = *(ushort *)((long)pmVar4->dx + lVar14 + lVar9);
              uVar5 = *(ushort *)((long)pmVar4->dy + lVar14 + lVar9);
              pcVar17 = "S";
              if ((short)uVar5 < 1) {
                pcVar17 = "N";
              }
              pcVar6 = "E";
              if ((short)uVar1 < 1) {
                pcVar6 = "W";
              }
              uVar10 = -uVar5;
              if (0 < (short)uVar5) {
                uVar10 = uVar5;
              }
              uVar5 = -uVar1;
              if (0 < (short)uVar1) {
                uVar5 = uVar1;
              }
              strnfmt(location,0x14," %d %s %d %s",(ulong)uVar10,pcVar17,(ulong)uVar5,pcVar6);
            }
            sVar7 = utf8_strlen(location);
            pmVar4 = list->entries;
            uVar1 = *(ushort *)((long)pmVar4->asleep + lVar14 + lVar9);
            uVar5 = *(ushort *)((long)pmVar4->neutral + lVar14 + lVar9);
            if (*(ushort *)((long)pmVar4->count + lVar14 + lVar9) < 2) {
              if (uVar1 == 1) {
                if (uVar5 == 1) {
                  pcVar17 = " (asleep, neutral)";
                }
                else {
                  pcVar17 = " (asleep)";
                }
              }
              else {
                if (uVar5 != 1) goto LAB_001f7b2e;
                pcVar17 = " (neutral)";
              }
              strnfmt(asleep,0x14,pcVar17);
            }
            else if (uVar1 == 0) {
              if (uVar5 != 0) {
                pcVar17 = " (%d neutral)";
                goto LAB_001f7b27;
              }
            }
            else if (uVar5 == 0) {
              pcVar17 = " (%d asleep)";
              uVar5 = uVar1;
LAB_001f7b27:
              strnfmt(asleep,0x14,pcVar17,(ulong)uVar5);
            }
            else {
              strnfmt(asleep,0x14," (%d asleep, %d neutral)");
            }
LAB_001f7b2e:
            lVar15 = ~sVar7 + (long)(max_width + L'\xfffffffe');
            sVar7 = utf8_strlen(asleep);
            sVar19 = 200;
            if (lVar15 - sVar7 < 0xc9) {
              sVar19 = utf8_strlen(asleep);
              sVar19 = lVar15 - sVar19;
            }
            pmVar4 = list->entries;
            get_mon_name(line_buffer,200,*(monster_race **)((long)pmVar4->count + lVar14 + -0x10),
                         *(player_race **)((long)pmVar4->count + lVar14 + -8),
                         (uint)*(ushort *)((long)pmVar4->count + uVar12 * 2 + lVar14));
            utf8_clipto(line_buffer,sVar19);
            my_strcat(line_buffer,asleep,200);
            sVar7 = utf8_strlen(line_buffer);
            if (local_168 < sVar7 + 0xe) {
              local_168 = utf8_strlen(line_buffer);
              local_168 = local_168 + 0xe;
            }
            if (((tb != (textblock *)0x0) && (tile_width == '\x01')) && (tile_height == '\x01')) {
              textblock_append_pict
                        (tb,*(uint8_t *)((long)list->entries->dy + lVar14 + 4),
                         monster_x_char
                         [*(uint *)(*(long *)((long)list->entries->count + lVar14 + -0x10) + 8)]);
              textblock_append(tb," ");
            }
            if (tb != (textblock *)0x0) {
              sVar8 = strlen(line_buffer);
              sVar7 = utf8_strlen(line_buffer);
              attr = monster_list_entry_line_color
                               ((monster_list_entry_t *)
                                ((long)list->entries->count + lVar14 + -0x10));
              textblock_append_c(tb,attr,"%-*s%s\n",
                                 (ulong)(uint)(((int)sVar8 + (int)lVar15) - (int)sVar7),line_buffer,
                                 location);
            }
            wVar16 = wVar16 + L'\x01';
          }
          uVar21 = uVar21 + 1;
        } while ((uVar21 < uVar20) && (lVar14 = lVar14 + 0x28, wVar16 < lines_to_display));
      }
      if (max_width_result != (size_t *)0x0) {
        *max_width_result = local_168;
      }
      if ((L'\0' < lines_to_display) && (lines_to_display < (int)(uint)list->total_entries[uVar12]))
      {
        uVar11 = 0;
        if ((uint)uVar21 < (uint)uVar2) {
          puVar13 = list->entries[uVar21 & 0xffffffff].count + uVar12;
          lVar9 = uVar20 - (uVar21 & 0xffffffff);
          uVar11 = 0;
          do {
            uVar11 = (ulong)((int)uVar11 + (uint)*puVar13);
            puVar13 = puVar13 + 0x14;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        if (tb != (textblock *)0x0) {
          textblock_append(tb,"%6s...and %d others.\n"," ",uVar11);
        }
      }
    }
  }
  return;
}

Assistant:

static void monster_list_format_section(const monster_list_t *list, textblock *tb, monster_list_section_t section, int lines_to_display, int max_width, const char *prefix, bool show_others, size_t *max_width_result)
{
	int remaining_monster_total = 0;
	int line_count = 0;
	int index;
	int total;
	char line_buffer[200];
	const char *punctuation = (lines_to_display == 0) ? "." : ":";
	const char *others = (show_others) ? "other " : "";
	size_t max_line_length = 0;

	if (list == NULL || list->entries == NULL)
		return;

	total = list->distinct_entries;

	if (list->total_monsters[section] == 0) {
		max_line_length = strnfmt(line_buffer, sizeof(line_buffer),
								  "%s no monsters.\n", prefix);

		if (tb != NULL)
			textblock_append(tb, "%s", line_buffer);

		/* Force a minimum width so that the prompt doesn't get cut off. */
		if (max_width_result != NULL)
			*max_width_result = MAX(max_line_length, 40);

		return;
	}

	max_line_length = strnfmt(line_buffer, sizeof(line_buffer),
							  "%s %d %smonster%s%s\n",
							  prefix,
							  list->total_monsters[section],
							  others,
							  PLURAL(list->total_monsters[section]),
							  punctuation);

	if (tb != NULL)
		textblock_append(tb, "%s", line_buffer);

	for (index = 0; index < total && line_count < lines_to_display; index++) {
		char asleep[20] = { '\0' };
		char location[20] = { '\0' };
		uint8_t line_attr;
		size_t full_width;
		size_t name_width;
		uint16_t count_in_section = 0;
		uint16_t asleep_in_section = 0;
		uint16_t neutral_in_section = 0;

		line_buffer[0] = '\0';

		if (list->entries[index].count[section] == 0)
			continue;

		/* Only display directions for the case of a single monster. */
		if (list->entries[index].count[section] == 1) {
			const char *direction1 =
				(list->entries[index].dy[section] <= 0)	? "N" : "S";
			const char *direction2 =
				(list->entries[index].dx[section] <= 0) ? "W" : "E";
			strnfmt(location, sizeof(location), " %d %s %d %s",
					abs(list->entries[index].dy[section]), direction1,
					abs(list->entries[index].dx[section]), direction2);
		}

		/* Get width available for monster name and sleep tag: 2 for char and
		 * space; location includes padding; last -1 for some reason? */
		full_width = max_width - 2 - utf8_strlen(location) - 1;

		asleep_in_section = list->entries[index].asleep[section];
		neutral_in_section = list->entries[index].neutral[section];
		count_in_section = list->entries[index].count[section];

		if (count_in_section > 1) {
			if (asleep_in_section > 0) {
				if (neutral_in_section > 0) {
					strnfmt(asleep, sizeof(asleep), " (%d asleep, %d neutral)",
							asleep_in_section, neutral_in_section);
				} else {
					strnfmt(asleep, sizeof(asleep), " (%d asleep)",
							asleep_in_section);
				}
			} else if (neutral_in_section > 0) {
					strnfmt(asleep, sizeof(asleep), " (%d neutral)",
							neutral_in_section);
			}
		} else {
			if (asleep_in_section == 1) {
				if (neutral_in_section == 1) {
					strnfmt(asleep, sizeof(asleep), " (asleep, neutral)");
				} else {
					strnfmt(asleep, sizeof(asleep), " (asleep)");
				}
			} else if (neutral_in_section == 1) {
				strnfmt(asleep, sizeof(asleep), " (neutral)");
			}
		}

		/* Clip the monster name to fit, and append the sleep tag. */
		name_width = MIN(full_width - utf8_strlen(asleep), sizeof(line_buffer));
		get_mon_name(line_buffer, sizeof(line_buffer),
					 list->entries[index].race,
					 list->entries[index].p_race,
					 list->entries[index].count[section]);
		utf8_clipto(line_buffer, name_width);
		my_strcat(line_buffer, asleep, sizeof(line_buffer));

		/* Calculate the width of the line for dynamic sizing; use a fixed max
		 * width for location and monster char. */
		max_line_length = MAX(max_line_length,
							  utf8_strlen(line_buffer) + 12 + 2);

		/* textblock_append_pict will safely add the monster symbol,
		 * regardless of ASCII/graphics mode. */
		if (tb != NULL && tile_width == 1 && tile_height == 1) {
			textblock_append_pict(tb, list->entries[index].attr, monster_x_char[list->entries[index].race->ridx]);
			textblock_append(tb, " ");
		}

		/* Add the left-aligned and padded monster name which will align the
		 * location to the right. */
		if (tb != NULL) {
			/* Hack - Because monster race strings are UTF8, we have to add
			 * additional padding for any raw bytes that might be consolidated
			 * into one displayed character. */
			full_width += strlen(line_buffer) - utf8_strlen(line_buffer);
			line_attr = monster_list_entry_line_color(&list->entries[index]);
			textblock_append_c(tb, line_attr, "%-*s%s\n",
				(int) full_width, line_buffer, location);
		}

		line_count++;
	}

	/* Don't worry about the "...others" line, since it's probably shorter
	 * than what's already printed. */
	if (max_width_result != NULL)
		*max_width_result = max_line_length;

	/* Bail since we don't have enough room to display the remaining count or
	 * since we've displayed them all. */
	if (lines_to_display <= 0 ||
		lines_to_display >= list->total_entries[section])
		return;

	/* Sum the remaining monsters; start where we left off in the above loop. */
	while (index < total) {
		remaining_monster_total += list->entries[index].count[section];
		index++;
	}

	if (tb != NULL)
		textblock_append(tb, "%6s...and %d others.\n", " ",
						 remaining_monster_total);
}